

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf271.c
# Opt level: O2

INT64 calculate_op(YMF271Chip *chip,int slotnum,INT64 inp)

{
  short sVar1;
  long lVar2;
  UINT64 UVar3;
  int iVar4;
  YMF271Slot *slot;
  int iVar5;
  
  slot = chip->slots + slotnum;
  update_envelope(slot);
  update_lfo(chip,slot);
  iVar4 = calculate_slot_volume(chip,slot);
  if (inp == -2) {
    iVar5 = 0;
  }
  else if (inp == -1) {
    lVar2 = chip->slots[slotnum].feedback_modulation1;
    iVar5 = (int)((chip->slots[slotnum].feedback_modulation0 + lVar2) / 2);
    chip->slots[slotnum].feedback_modulation0 = lVar2;
  }
  else {
    iVar5 = (int)inp * modulation_level[chip->slots[slotnum].feedback] * 0x100;
  }
  UVar3 = chip->slots[slotnum].stepptr;
  sVar1 = *(short *)((long)chip->lut_waves[chip->slots[slotnum].waveform] +
                    (ulong)((uint)(iVar5 + (int)UVar3) >> 0xf & 0x7fe));
  chip->slots[slotnum].stepptr = chip->slots[slotnum].step + UVar3;
  return (long)sVar1 * (long)iVar4 >> 0x10;
}

Assistant:

static INT64 calculate_op(YMF271Chip *chip, int slotnum, INT64 inp)
{
	YMF271Slot *slot = &chip->slots[slotnum];
	INT64 env, slot_output, slot_input = 0;

	update_envelope(slot);
	update_lfo(chip, slot);
	env = calculate_slot_volume(chip, slot);

	if (inp == OP_INPUT_FEEDBACK)
	{
		// from own feedback
		slot_input = (slot->feedback_modulation0 + slot->feedback_modulation1) / 2;
		slot->feedback_modulation0 = slot->feedback_modulation1;
	}
	else if (inp != OP_INPUT_NONE)
	{
		// from previous slot output
		slot_input = ((inp << (SIN_BITS-2)) * modulation_level[slot->feedback]);
	}

	slot_output = chip->lut_waves[slot->waveform][((slot->stepptr + slot_input) >> 16) & SIN_MASK];
	slot_output = (slot_output * env) >> 16;
	slot->stepptr += slot->step;

	return slot_output;
}